

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_multiply(mat4 m1,mat4 m2)

{
  mat4 *in_RDI;
  
  in_RDI->m[0] = m1.m[3] * m2.m[0xc] + m1.m[2] * m2.m[8] + m1.m[0] * m2.m[0] + m1.m[1] * m2.m[4];
  in_RDI->m[1] = m1.m[3] * m2.m[0xd] + m1.m[2] * m2.m[9] + m1.m[0] * m2.m[1] + m1.m[1] * m2.m[5];
  in_RDI->m[2] = m1.m[3] * m2.m[0xe] + m1.m[2] * m2.m[10] + m1.m[0] * m2.m[2] + m1.m[1] * m2.m[6];
  in_RDI->m[3] = m1.m[3] * m2.m[0xf] + m1.m[2] * m2.m[0xb] + m1.m[0] * m2.m[3] + m1.m[1] * m2.m[7];
  in_RDI->m[4] = m1.m[7] * m2.m[0xc] + m1.m[6] * m2.m[8] + m1.m[4] * m2.m[0] + m2.m[4] * m1.m[5];
  in_RDI->m[5] = m1.m[7] * m2.m[0xd] + m1.m[6] * m2.m[9] + m1.m[4] * m2.m[1] + m2.m[5] * m1.m[5];
  in_RDI->m[6] = m1.m[7] * m2.m[0xe] + m1.m[6] * m2.m[10] + m1.m[4] * m2.m[2] + m2.m[6] * m1.m[5];
  in_RDI->m[7] = m1.m[7] * m2.m[0xf] + m1.m[6] * m2.m[0xb] + m1.m[4] * m2.m[3] + m1.m[5] * m2.m[7];
  in_RDI->m[8] = m1.m[0xb] * m2.m[0xc] + m1.m[10] * m2.m[8] + m1.m[8] * m2.m[0] + m2.m[4] * m1.m[9];
  in_RDI->m[9] = m1.m[0xb] * m2.m[0xd] + m1.m[10] * m2.m[9] + m1.m[8] * m2.m[1] + m2.m[5] * m1.m[9];
  in_RDI->m[10] =
       m1.m[0xb] * m2.m[0xe] + m1.m[10] * m2.m[10] + m1.m[8] * m2.m[2] + m2.m[6] * m1.m[9];
  in_RDI->m[0xb] =
       m1.m[0xb] * m2.m[0xf] + m1.m[10] * m2.m[0xb] + m1.m[8] * m2.m[3] + m1.m[9] * m2.m[7];
  in_RDI->m[0xc] =
       m2.m[0xc] * m1.m[0xf] + m2.m[8] * m1.m[0xe] + m2.m[0] * m1.m[0xc] + m2.m[4] * m1.m[0xd];
  in_RDI->m[0xd] =
       m2.m[0xd] * m1.m[0xf] + m2.m[9] * m1.m[0xe] + m2.m[1] * m1.m[0xc] + m2.m[5] * m1.m[0xd];
  in_RDI->m[0xe] =
       m2.m[0xe] * m1.m[0xf] + m2.m[10] * m1.m[0xe] + m2.m[2] * m1.m[0xc] + m2.m[6] * m1.m[0xd];
  in_RDI->m[0xf] =
       m1.m[0xf] * m2.m[0xf] + m1.m[0xe] * m2.m[0xb] + m1.m[0xc] * m2.m[3] + m2.m[7] * m1.m[0xd];
  return in_RDI;
}

Assistant:

mat4 mat4_multiply(mat4 m1, mat4 m2) {
    float *a = m1.m;
    float *b = m2.m;

    float c0 = a[0] * b[0] + a[1] * b[4] + a[2] * b[8] + a[3] * b[12];
    float c1 = a[0] * b[1] + a[1] * b[5] + a[2] * b[9] + a[3] * b[13];
    float c2 = a[0] * b[2] + a[1] * b[6] + a[2] * b[10] + a[3] * b[14];
    float c3 = a[0] * b[3] + a[1] * b[7] + a[2] * b[11] + a[3] * b[15];

    float c4 = a[4] * b[0] + a[5] * b[4] + a[6] * b[8] + a[7] * b[12];
    float c5 = a[4] * b[1] + a[5] * b[5] + a[6] * b[9] + a[7] * b[13];
    float c6 = a[4] * b[2] + a[5] * b[6] + a[6] * b[10] + a[7] * b[14];
    float c7 = a[4] * b[3] + a[5] * b[7] + a[6] * b[11] + a[7] * b[15];

    float c8 = a[8] * b[0] + a[9] * b[4] + a[10] * b[8] + a[11] * b[12];
    float c9 = a[8] * b[1] + a[9] * b[5] + a[10] * b[9] + a[11] * b[13];
    float c10 = a[8] * b[2] + a[9] * b[6] + a[10] * b[10] + a[11] * b[14];
    float c11 = a[8] * b[3] + a[9] * b[7] + a[10] * b[11] + a[11] * b[15];

    float c12 = a[12] * b[0] + a[13] * b[4] + a[14] * b[8] + a[15] * b[12];
    float c13 = a[12] * b[1] + a[13] * b[5] + a[14] * b[9] + a[15] * b[13];
    float c14 = a[12] * b[2] + a[13] * b[6] + a[14] * b[10] + a[15] * b[14];
    float c15 = a[12] * b[3] + a[13] * b[7] + a[14] * b[11] + a[15] * b[15];

    return mat4_create(
            c0, c1, c2, c3,
            c4, c5, c6, c7,
            c8, c9, c10, c11,
            c12, c13, c14, c15);
}